

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::JunitReporter::testGroupStarting(JunitReporter *this,GroupInfo *groupInfo)

{
  GroupInfo *groupInfo_local;
  JunitReporter *this_local;
  
  Timer::start(&this->suiteTimer);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  this->unexpectedExceptions = 0;
  CumulativeReporterBase<Catch::JunitReporter>::testGroupStarting
            (&this->super_CumulativeReporterBase<Catch::JunitReporter>,groupInfo);
  return;
}

Assistant:

void JunitReporter::testGroupStarting( GroupInfo const& groupInfo ) {
        suiteTimer.start();
        stdOutForSuite.clear();
        stdErrForSuite.clear();
        unexpectedExceptions = 0;
        CumulativeReporterBase::testGroupStarting( groupInfo );
    }